

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  char *__format;
  ulong uVar4;
  long lVar5;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,typecode);
  if (uVar3 == 4) {
    uVar3 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar3 != '\x03') {
    if ((uVar3 & 0xff) == 2) {
      array_container_printf_as_uint32_array((array_container_t *)c,base);
      return;
    }
    bVar2 = true;
    lVar5 = 0;
    do {
      uVar4 = *(ulong *)(((array_container_t *)c)->array + lVar5 * 4);
      if (uVar4 != 0) {
        __format = ",%u";
        if (bVar2) {
          __format = "%u";
        }
        do {
          lVar1 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          bVar2 = false;
          printf(__format,(ulong)((int)lVar1 + base));
          uVar4 = uVar4 & uVar4 - 1;
          __format = ",%u";
        } while (uVar4 != 0);
      }
      base = base + 0x40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
    return;
  }
  run_container_printf_as_uint32_array((run_container_t *)c,base);
  return;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}